

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

double __thiscall ON_PolyCurve::SegmentCurveParameter(ON_PolyCurve *this,double polycurve_parameter)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint segment_index;
  ON_Curve *pOVar4;
  double x;
  ON_Interval sdom;
  ON_Interval cdom;
  ON_Interval local_38;
  ON_Interval local_28;
  
  iVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar3 = ON_SearchMonotoneArray((this->m_t).m_a,(this->m_t).m_count,polycurve_parameter);
  segment_index = iVar1 - 1;
  if ((int)uVar3 < iVar1) {
    segment_index = uVar3;
  }
  pOVar4 = (ON_Curve *)0x0;
  if ((int)uVar3 < 0) {
    segment_index = 0;
  }
  if ((-1 < (int)segment_index) &&
     ((int)segment_index < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
    pOVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[segment_index];
  }
  if (pOVar4 == (ON_Curve *)0x0) {
    polycurve_parameter = -1.23432101234321e+308;
  }
  else {
    (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    local_38 = SegmentDomain(this,segment_index);
    bVar2 = ON_Interval::operator==(&local_28,&local_38);
    if (!bVar2) {
      x = ON_Interval::NormalizedParameterAt(&local_38,polycurve_parameter);
      polycurve_parameter = ON_Interval::ParameterAt(&local_28,x);
    }
  }
  return polycurve_parameter;
}

Assistant:

double ON_PolyCurve::SegmentCurveParameter(
  double polycurve_parameter
  ) const
{
  int segment_index = SegmentIndex( polycurve_parameter );
  const ON_Curve* segment_curve = SegmentCurve(segment_index);
  if ( !segment_curve )
    return ON_UNSET_VALUE;
  ON_Interval cdom = segment_curve->Domain();
  ON_Interval sdom = SegmentDomain(segment_index);
  if ( cdom == sdom )
    return polycurve_parameter;
  double s = sdom.NormalizedParameterAt(polycurve_parameter);
  return cdom.ParameterAt(s);
}